

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# peer.c
# Opt level: O0

int enet_peer_send(ENetPeer *peer,enet_uint8 channelID,ENetPacket *packet)

{
  uint16_t uVar1;
  uint16_t uVar2;
  uint __hostlong;
  uint32_t uVar3;
  short *psVar4;
  ENetOutgoingCommand *pEVar5;
  long *in_RDX;
  byte in_SIL;
  long in_RDI;
  ENetOutgoingCommand *fragment;
  ENetList fragments;
  enet_uint16 startSequenceNumber;
  enet_uint8 commandNumber;
  enet_uint32 fragmentOffset;
  enet_uint32 fragmentNumber;
  enet_uint32 fragmentCount;
  size_t fragmentLength;
  ENetProtocol command;
  ENetChannel *channel;
  void *in_stack_ffffffffffffff70;
  ENetOutgoingCommand *in_stack_ffffffffffffff78;
  ENetProtocol *in_stack_ffffffffffffff80;
  enet_uint16 in_stack_ffffffffffffff88;
  undefined1 in_stack_ffffffffffffff8a;
  undefined1 in_stack_ffffffffffffff8b;
  undefined1 uVar6;
  enet_uint32 in_stack_ffffffffffffff8c;
  uint __netlong;
  uint32_t local_70;
  ulong local_68;
  int local_4;
  
  psVar4 = (short *)(*(long *)(in_RDI + 0x40) + (ulong)in_SIL * 0x50);
  if (((*(int *)(in_RDI + 0x38) == 5) && ((ulong)in_SIL < *(ulong *)(in_RDI + 0x48))) &&
     ((ulong)in_RDX[3] <= *(ulong *)(*(long *)(in_RDI + 0x10) + 0x2b40))) {
    local_68 = (ulong)*(uint *)(in_RDI + 0xd0) - 0x1e;
    if (*(long *)(*(long *)(in_RDI + 0x10) + 0xad0) != 0) {
      local_68 = (ulong)*(uint *)(in_RDI + 0xd0) - 0x22;
    }
    if (local_68 < (ulong)in_RDX[3]) {
      __hostlong = (uint)(((in_RDX[3] + local_68) - 1) / local_68);
      if (__hostlong < 0x100001) {
        if (((*(uint *)(in_RDX + 1) & 9) == 8) && ((ushort)psVar4[1] < 0xffff)) {
          uVar6 = 0xc;
          uVar1 = htons(psVar4[1] + 1);
        }
        else {
          uVar6 = 0x88;
          uVar1 = htons(*psVar4 + 1);
        }
        enet_list_clear((ENetList *)&stack0xffffffffffffff78);
        local_70 = 0;
        for (__netlong = 0; (ulong)__netlong < (ulong)in_RDX[3];
            __netlong = __netlong + (int)local_68) {
          if (in_RDX[3] - (ulong)__netlong < local_68) {
            local_68 = in_RDX[3] - (ulong)__netlong;
          }
          in_stack_ffffffffffffff70 = enet_malloc((size_t)in_stack_ffffffffffffff70);
          if (in_stack_ffffffffffffff70 == (void *)0x0) {
            while (in_stack_ffffffffffffff78 != (ENetOutgoingCommand *)&stack0xffffffffffffff78) {
              enet_list_remove(&in_stack_ffffffffffffff78->outgoingCommandList);
              enet_free((void *)0x106afc);
            }
            return -1;
          }
          *(uint *)((long)in_stack_ffffffffffffff70 + 0x20) = __netlong;
          *(uint16_t *)((long)in_stack_ffffffffffffff70 + 0x24) = (uint16_t)local_68;
          *(long **)((long)in_stack_ffffffffffffff70 + 0x60) = in_RDX;
          *(undefined1 *)((long)in_stack_ffffffffffffff70 + 0x28) = uVar6;
          *(byte *)((long)in_stack_ffffffffffffff70 + 0x29) = in_SIL;
          *(uint16_t *)((long)in_stack_ffffffffffffff70 + 0x2c) = uVar1;
          uVar2 = htons((uint16_t)local_68);
          *(uint16_t *)((long)in_stack_ffffffffffffff70 + 0x2e) = uVar2;
          uVar3 = htonl(__hostlong);
          *(uint32_t *)((long)in_stack_ffffffffffffff70 + 0x30) = uVar3;
          uVar3 = htonl(local_70);
          *(uint32_t *)((long)in_stack_ffffffffffffff70 + 0x34) = uVar3;
          uVar3 = htonl((uint32_t)in_RDX[3]);
          *(uint32_t *)((long)in_stack_ffffffffffffff70 + 0x38) = uVar3;
          uVar3 = ntohl(__netlong);
          *(uint32_t *)((long)in_stack_ffffffffffffff70 + 0x3c) = uVar3;
          enet_list_insert((ENetListIterator)&stack0xffffffffffffff78,in_stack_ffffffffffffff70);
          local_70 = local_70 + 1;
        }
        *in_RDX = (ulong)local_70 + *in_RDX;
        while (in_stack_ffffffffffffff78 != (ENetOutgoingCommand *)&stack0xffffffffffffff78) {
          enet_list_remove(&in_stack_ffffffffffffff78->outgoingCommandList);
          enet_peer_setup_outgoing_command
                    ((ENetPeer *)&in_stack_ffffffffffffff80->header,in_stack_ffffffffffffff78);
        }
        local_4 = 0;
      }
      else {
        local_4 = -1;
      }
    }
    else {
      if ((*(uint *)(in_RDX + 1) & 3) == 2) {
        htons((uint16_t)in_RDX[3]);
      }
      else if (((*(uint *)(in_RDX + 1) & 1) == 0) && (psVar4[1] != -1)) {
        htons((uint16_t)in_RDX[3]);
      }
      else {
        htons((uint16_t)in_RDX[3]);
      }
      pEVar5 = enet_peer_queue_outgoing_command
                         ((ENetPeer *)
                          CONCAT44(in_stack_ffffffffffffff8c,
                                   CONCAT13(in_stack_ffffffffffffff8b,
                                            CONCAT12(in_stack_ffffffffffffff8a,
                                                     in_stack_ffffffffffffff88))),
                          in_stack_ffffffffffffff80,(ENetPacket *)in_stack_ffffffffffffff78,
                          (enet_uint32)((ulong)in_stack_ffffffffffffff70 >> 0x20),
                          (enet_uint16)((ulong)in_stack_ffffffffffffff70 >> 0x10));
      if (pEVar5 == (ENetOutgoingCommand *)0x0) {
        local_4 = -1;
      }
      else {
        local_4 = 0;
      }
    }
  }
  else {
    local_4 = -1;
  }
  return local_4;
}

Assistant:

int
enet_peer_send (ENetPeer * peer, enet_uint8 channelID, ENetPacket * packet)
{
   ENetChannel * channel = & peer -> channels [channelID];
   ENetProtocol command;
   size_t fragmentLength;

   if (peer -> state != ENET_PEER_STATE_CONNECTED ||
       channelID >= peer -> channelCount ||
       packet -> dataLength > peer -> host -> maximumPacketSize)
     return -1;

   fragmentLength = peer -> mtu - sizeof (ENetProtocolHeader) - sizeof (ENetProtocolSendFragment);
   if (peer -> host -> checksum != NULL)
     fragmentLength -= sizeof(enet_uint32);

   if (packet -> dataLength > fragmentLength)
   {
      enet_uint32 fragmentCount = (packet -> dataLength + fragmentLength - 1) / fragmentLength,
             fragmentNumber,
             fragmentOffset;
      enet_uint8 commandNumber;
      enet_uint16 startSequenceNumber; 
      ENetList fragments;
      ENetOutgoingCommand * fragment;

      if (fragmentCount > ENET_PROTOCOL_MAXIMUM_FRAGMENT_COUNT)
        return -1;

      if ((packet -> flags & (ENET_PACKET_FLAG_RELIABLE | ENET_PACKET_FLAG_UNRELIABLE_FRAGMENT)) == ENET_PACKET_FLAG_UNRELIABLE_FRAGMENT &&
          channel -> outgoingUnreliableSequenceNumber < 0xFFFF)
      {
         commandNumber = ENET_PROTOCOL_COMMAND_SEND_UNRELIABLE_FRAGMENT;
         startSequenceNumber = ENET_HOST_TO_NET_16 (channel -> outgoingUnreliableSequenceNumber + 1);
      }
      else
      {
         commandNumber = ENET_PROTOCOL_COMMAND_SEND_FRAGMENT | ENET_PROTOCOL_COMMAND_FLAG_ACKNOWLEDGE;
         startSequenceNumber = ENET_HOST_TO_NET_16 (channel -> outgoingReliableSequenceNumber + 1);
      }
        
      enet_list_clear (& fragments);

      for (fragmentNumber = 0,
             fragmentOffset = 0;
           fragmentOffset < packet -> dataLength;
           ++ fragmentNumber,
             fragmentOffset += fragmentLength)
      {
         if (packet -> dataLength - fragmentOffset < fragmentLength)
           fragmentLength = packet -> dataLength - fragmentOffset;

         fragment = (ENetOutgoingCommand *) enet_malloc (sizeof (ENetOutgoingCommand));
         if (fragment == NULL)
         {
            while (! enet_list_empty (& fragments))
            {
               fragment = (ENetOutgoingCommand *) enet_list_remove (enet_list_begin (& fragments));
               
               enet_free (fragment);
            }
            
            return -1;
         }
         
         fragment -> fragmentOffset = fragmentOffset;
         fragment -> fragmentLength = fragmentLength;
         fragment -> packet = packet;
         fragment -> command.header.command = commandNumber;
         fragment -> command.header.channelID = channelID;
         fragment -> command.sendFragment.startSequenceNumber = startSequenceNumber;
         fragment -> command.sendFragment.dataLength = ENET_HOST_TO_NET_16 (fragmentLength);
         fragment -> command.sendFragment.fragmentCount = ENET_HOST_TO_NET_32 (fragmentCount);
         fragment -> command.sendFragment.fragmentNumber = ENET_HOST_TO_NET_32 (fragmentNumber);
         fragment -> command.sendFragment.totalLength = ENET_HOST_TO_NET_32 (packet -> dataLength);
         fragment -> command.sendFragment.fragmentOffset = ENET_NET_TO_HOST_32 (fragmentOffset);
        
         enet_list_insert (enet_list_end (& fragments), fragment);
      }

      packet -> referenceCount += fragmentNumber;

      while (! enet_list_empty (& fragments))
      {
         fragment = (ENetOutgoingCommand *) enet_list_remove (enet_list_begin (& fragments));
 
         enet_peer_setup_outgoing_command (peer, fragment);
      }

      return 0;
   }

   command.header.channelID = channelID;

   if ((packet -> flags & (ENET_PACKET_FLAG_RELIABLE | ENET_PACKET_FLAG_UNSEQUENCED)) == ENET_PACKET_FLAG_UNSEQUENCED)
   {
      command.header.command = ENET_PROTOCOL_COMMAND_SEND_UNSEQUENCED | ENET_PROTOCOL_COMMAND_FLAG_UNSEQUENCED;
      command.sendUnsequenced.dataLength = ENET_HOST_TO_NET_16 (packet -> dataLength);
   }
   else 
   if (packet -> flags & ENET_PACKET_FLAG_RELIABLE || channel -> outgoingUnreliableSequenceNumber >= 0xFFFF)
   {
      command.header.command = ENET_PROTOCOL_COMMAND_SEND_RELIABLE | ENET_PROTOCOL_COMMAND_FLAG_ACKNOWLEDGE;
      command.sendReliable.dataLength = ENET_HOST_TO_NET_16 (packet -> dataLength);
   }
   else
   {
      command.header.command = ENET_PROTOCOL_COMMAND_SEND_UNRELIABLE;
      command.sendUnreliable.dataLength = ENET_HOST_TO_NET_16 (packet -> dataLength);
   }

   if (enet_peer_queue_outgoing_command (peer, & command, packet, 0, packet -> dataLength) == NULL)
     return -1;

   return 0;
}